

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O0

bool __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  bool bVar1;
  __type _Var2;
  reference __lhs;
  __type local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  iterator __end0;
  iterator __begin0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src_local;
  uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  __range2._4_4_ = 0;
  __end0 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->path);
  v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->path);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&v);
    if (!bVar1) break;
    __lhs = std::
            _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end0);
    _Var2 = std::operator==(__lhs,src);
    local_59 = true;
    if (!_Var2) {
      local_59 = std::operator==(__lhs,des);
    }
    __range2._4_4_ = (uint)local_59 + __range2._4_4_;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end0);
  }
  return __range2._4_4_ == 2;
}

Assistant:

bool check(ver src, ver des) {//check if path is possible
      int f = 0;
      for (auto &v : path)
        f += v == src || v == des;
      return f == 2;
    }